

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::LinearSegmentParameter
          (LinearSegmentParameter *this,KUINT8 SegNum,KUINT8 Mod,LinearObjectAppearance *A,
          WorldCoordinates *Loc,EulerAngles *Ori,KUINT16 Length,KUINT16 Width,KUINT16 Height,
          KUINT16 Depth)

{
  EulerAngles *Ori_local;
  WorldCoordinates *Loc_local;
  LinearObjectAppearance *A_local;
  KUINT8 Mod_local;
  KUINT8 SegNum_local;
  LinearSegmentParameter *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__LinearSegmentParameter_00332048;
  this->m_ui8SegNum = SegNum;
  LinearObjectAppearance::LinearObjectAppearance(&this->m_ObjApr,A);
  WorldCoordinates::WorldCoordinates(&this->m_Loc,Loc);
  EulerAngles::EulerAngles(&this->m_Ori,Ori);
  this->m_ui16Length = Length;
  this->m_ui16Width = Width;
  this->m_ui16Height = Height;
  this->m_ui16Depth = Depth;
  this->m_ui32Padding = 0;
  (this->m_ModificationUnion).m_ui8Modifications = Mod;
  return;
}

Assistant:

LinearSegmentParameter::LinearSegmentParameter( KUINT8 SegNum, KUINT8 Mod, const LinearObjectAppearance & A,
        const WorldCoordinates & Loc, const EulerAngles & Ori,
        KUINT16 Length, KUINT16 Width, KUINT16 Height, KUINT16 Depth ) :
    m_ui8SegNum( SegNum ),
    m_ObjApr( A ),
    m_Loc( Loc ),
    m_Ori( Ori ),
    m_ui16Length( Length ),
    m_ui16Width( Width ),
    m_ui16Height( Height ),
    m_ui16Depth( Depth ),
    m_ui32Padding( 0 )
{
    m_ModificationUnion.m_ui8Modifications = Mod;
}